

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

Ratio * __thiscall Ratio::reverse(Ratio *this)

{
  bool bVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  PhyloTreeEdge *in_RDI;
  PhyloTreeEdge *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge *e;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> fvec;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> evec;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff48;
  PhyloTreeEdge *__args;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *e_00;
  reference in_stack_ffffffffffffff70;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_80;
  size_type in_stack_ffffffffffffff88;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff90;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_60;
  pointer *local_58;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_28;
  
  e_00 = &local_28;
  __args = in_RDI;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x18c7a3);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x18c7ad);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             &(in_RSI->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             &in_RSI[1].super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_58 = &(in_RSI->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_60._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff48);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_RDI,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_60);
    std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
              (in_RSI,__args);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_60);
  }
  local_80._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff48);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_RDI,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         __gnu_cxx::
         __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
         ::operator*(&local_80);
    std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
              (in_RSI,__args);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_80);
  }
  Ratio((Ratio *)in_stack_ffffffffffffff70,e_00,in_RSI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(in_RSI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(in_RSI);
  return (Ratio *)__args;
}

Assistant:

Ratio Ratio::reverse() {
    vector<PhyloTreeEdge> evec, fvec;
    evec.reserve(eEdges.size());
    fvec.reserve(fEdges.size());
    for (auto &e : eEdges) {
        evec.emplace_back(e);
    }
    for (auto &f : fEdges) {
        fvec.emplace_back(f);
    }
    return Ratio(fvec, evec);
}